

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O2

void __thiscall
ObjTable<QPDFWriter::NewObject>::forEach
          (ObjTable<QPDFWriter::NewObject> *this,
          function<void_(int,_const_QPDFWriter::NewObject_&)> *fn)

{
  pointer pNVar1;
  int iVar2;
  ObjTable<QPDFWriter::NewObject> *__range2;
  NewObject *item;
  pointer __args_1;
  _Base_ptr p_Var3;
  
  pNVar1 = (this->super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>).
           super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>._M_impl
           .super__Vector_impl_data._M_finish;
  iVar2 = 0;
  for (__args_1 = (this->super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                  ).
                  super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
                  _M_impl.super__Vector_impl_data._M_start; __args_1 != pNVar1;
      __args_1 = __args_1 + 1) {
    std::function<void_(int,_const_QPDFWriter::NewObject_&)>::operator()(fn,iVar2,__args_1);
    iVar2 = iVar2 + 1;
  }
  for (p_Var3 = (this->sparse_elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->sparse_elements)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    iVar2 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                      ((unsigned_long *)(p_Var3 + 1));
    std::function<void_(int,_const_QPDFWriter::NewObject_&)>::operator()
              (fn,iVar2,(NewObject *)&p_Var3[1]._M_parent);
  }
  return;
}

Assistant:

inline void
    forEach(std::function<void(int, const T&)> fn)
    {
        int i = 0;
        for (auto const& item: *this) {
            fn(i++, item);
        }
        for (auto const& [id, item]: sparse_elements) {
            fn(QIntC::to_int(id), item);
        }
    }